

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::TraceDependencies(cmGeneratorTarget *this)

{
  int iVar1;
  undefined1 local_100 [8];
  cmTargetTraceDependencies tracer;
  cmGeneratorTarget *this_local;
  
  tracer.NewSources.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  iVar1 = GetType(this);
  if (iVar1 != 6) {
    cmTargetTraceDependencies::cmTargetTraceDependencies
              ((cmTargetTraceDependencies *)local_100,this);
    cmTargetTraceDependencies::Trace((cmTargetTraceDependencies *)local_100);
    cmTargetTraceDependencies::~cmTargetTraceDependencies((cmTargetTraceDependencies *)local_100);
  }
  return;
}

Assistant:

void cmGeneratorTarget::TraceDependencies()
{
  // CMake-generated targets have no dependencies to trace.  Normally tracing
  // would find nothing anyway, but when building CMake itself the "install"
  // target command ends up referencing the "cmake" target but we do not
  // really want the dependency because "install" depend on "all" anyway.
  if(this->GetType() == cmTarget::GLOBAL_TARGET)
    {
    return;
    }

  // Use a helper object to trace the dependencies.
  cmTargetTraceDependencies tracer(this);
  tracer.Trace();
}